

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_1::PerPatchDataCase::caseTypeUsesRefImageFromFile
               (CaseType type)

{
  CaseType type_local;
  
  return type < CASETYPE_PATCH_VERTICES_IN_TCS;
}

Assistant:

bool PerPatchDataCase::caseTypeUsesRefImageFromFile (CaseType type)
{
	switch (type)
	{
		case CASETYPE_PRIMITIVE_ID_TCS:
		case CASETYPE_PRIMITIVE_ID_TES:
			return true;

		default:
			return false;
	}
}